

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void lodepng::convertToXYZ_gamma_table
               (float *out,size_t n,size_t c,LodePNGInfo *info,uint use_icc,LodePNGICC *icc)

{
  long in_RCX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 in_R9;
  float fVar1;
  float v_2;
  float v_1;
  float gamma;
  float v;
  float mul;
  size_t i;
  float local_78;
  float local_70;
  float local_60;
  float local_50;
  ulong uVar2;
  undefined4 in_stack_ffffffffffffffd8;
  
  local_50 = (float)(in_RSI - 1);
  if (in_R8D == 0) {
    if ((*(int *)(in_RCX + 0xb4) == 0) || (*(int *)(in_RCX + 0xe0) != 0)) {
      for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
        local_70 = (float)uVar2;
        local_70 = local_70 * (1.0 / local_50);
        if (0.04045 <= local_70) {
          local_78 = lodepng_powf((float)in_R9,(float)(uVar2 >> 0x20));
        }
        else {
          local_78 = local_70 / 12.92;
        }
        *(float *)(in_RDI + uVar2 * 4) = local_78;
      }
    }
    else if (*(int *)(in_RCX + 0xb8) == 100000) {
      for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
        local_60 = (float)uVar2;
        *(float *)(in_RDI + uVar2 * 4) = local_60 * (1.0 / local_50);
      }
    }
    else {
      for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
        fVar1 = lodepng_powf((float)in_R9,(float)(uVar2 >> 0x20));
        *(float *)(in_RDI + uVar2 * 4) = fVar1;
      }
    }
  }
  else {
    for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
      fVar1 = iccForwardTRC((LodePNGICCCurve *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                            (float)((ulong)in_R9 >> 0x20));
      *(float *)(in_RDI + uVar2 * 4) = fVar1;
    }
  }
  return;
}

Assistant:

static void convertToXYZ_gamma_table(float* out, size_t n, size_t c,
                                     const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc) {
  size_t i;
  float mul = 1.0f / (n - 1);
  if(use_icc) {
    for(i = 0; i < n; i++) {
      float v = i * mul;
      out[i] = iccForwardTRC(&icc->trc[c], v);
    }
  } else if(info->gama_defined && !info->srgb_defined) {
    /* no power needed if gamma is 1 */
    if(info->gama_gamma == 100000) {
      for(i = 0; i < n; i++) {
        out[i] = i * mul;
      }
    } else {
      float gamma = 100000.0f / info->gama_gamma;
      for(i = 0; i < n; i++) {
        float v = i * mul;
        out[i] = lodepng_powf(v, gamma);
      }
    }
  } else {
    for(i = 0; i < n; i++) {
      /* sRGB gamma expand */
      float v = i * mul;
      out[i] = (v < 0.04045f) ? (v / 12.92f) : lodepng_powf((v + 0.055f) / 1.055f, 2.4f);
    }
  }
}